

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void freeCursorConstraints(RtreeCursor *pCsr)

{
  void *p;
  int iVar1;
  RtreeConstraint *p_00;
  long lVar2;
  long lVar3;
  
  p_00 = pCsr->aConstraint;
  if (p_00 != (RtreeConstraint *)0x0) {
    iVar1 = pCsr->nConstraint;
    if (0 < iVar1) {
      lVar3 = 0x10;
      lVar2 = 0;
      do {
        p = *(void **)((long)&pCsr->aConstraint->iCoord + lVar3);
        if (p != (void *)0x0) {
          if (*(code **)((long)p + 0x20) != (code *)0x0) {
            (**(code **)((long)p + 0x20))(*(undefined8 *)((long)p + 0x18));
          }
          sqlite3_free(p);
          iVar1 = pCsr->nConstraint;
        }
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x18;
      } while (lVar2 < iVar1);
      p_00 = pCsr->aConstraint;
    }
    sqlite3_free(p_00);
    pCsr->aConstraint = (RtreeConstraint *)0x0;
  }
  return;
}

Assistant:

static void freeCursorConstraints(RtreeCursor *pCsr){
  if( pCsr->aConstraint ){
    int i;                        /* Used to iterate through constraint array */
    for(i=0; i<pCsr->nConstraint; i++){
      sqlite3_rtree_query_info *pInfo = pCsr->aConstraint[i].pInfo;
      if( pInfo ){
        if( pInfo->xDelUser ) pInfo->xDelUser(pInfo->pUser);
        sqlite3_free(pInfo);
      }
    }
    sqlite3_free(pCsr->aConstraint);
    pCsr->aConstraint = 0;
  }
}